

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O2

void test_bson_visit_unsupported_type(void)

{
  char cVar1;
  undefined8 uVar2;
  char *pcVar3;
  unsupported_type_test_data_t context;
  char data [13];
  bson_iter_t iter;
  bson_t b;
  bson_visitor_t visitor;
  undefined8 local_330;
  char *pcStack_328;
  undefined8 local_320;
  undefined5 local_310;
  undefined3 uStack_30b;
  undefined5 uStack_308;
  undefined1 local_300 [128];
  undefined1 local_280 [224];
  undefined1 local_1a0 [184];
  code *local_e8;
  
  local_310 = 0x330000000c;
  uStack_30b = 0x1006b;
  uStack_308 = 0;
  local_330 = 0;
  pcStack_328 = (char *)0x0;
  local_320 = 0;
  memset(local_1a0,0,0x100);
  local_e8 = visit_unsupported_type;
  cVar1 = bson_init_static(local_280,&local_310,0xc);
  if (cVar1 == '\0') {
    pcVar3 = "bson_init_static (&b, (const uint8_t *) data, sizeof data - 1)";
    uVar2 = 0x85f;
  }
  else {
    cVar1 = bson_iter_init(local_300,local_280);
    if (cVar1 == '\0') {
      pcVar3 = "bson_iter_init (&iter, &b)";
      uVar2 = 0x860;
    }
    else {
      bson_iter_visit_all(local_300,local_1a0,&local_330);
      cVar1 = bson_iter_next(local_300);
      if (cVar1 == '\0') {
        if ((char)local_330 == '\0') {
          pcVar3 = "context.visited";
          uVar2 = 0x863;
        }
        else if ((*pcStack_328 == 'k') && (pcStack_328[1] == '\0')) {
          if ((int)local_320 == 0x33) {
            return;
          }
          pcVar3 = "context.type_code == \'\\x33\'";
          uVar2 = 0x865;
        }
        else {
          pcVar3 = "!strcmp (context.key, \"k\")";
          uVar2 = 0x864;
        }
      }
      else {
        pcVar3 = "!bson_iter_next (&iter)";
        uVar2 = 0x862;
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
          uVar2,"test_bson_visit_unsupported_type",pcVar3);
  abort();
}

Assistant:

static void
test_bson_visit_unsupported_type (void)
{
   /* {k: 1}, but instead of BSON type 0x10 (int32), use unknown type 0x33 */
   const char data[] = "\x0c\x00\x00\x00\x33k\x00\x01\x00\x00\x00\x00";
   bson_t b;
   bson_iter_t iter;
   unsupported_type_test_data_t context = {0};
   bson_visitor_t visitor = {0};

   visitor.visit_unsupported_type = visit_unsupported_type;

   BSON_ASSERT (bson_init_static (&b, (const uint8_t *) data, sizeof data - 1));
   BSON_ASSERT (bson_iter_init (&iter, &b));
   bson_iter_visit_all (&iter, &visitor, (void *) &context);
   BSON_ASSERT (!bson_iter_next (&iter));
   BSON_ASSERT (context.visited);
   BSON_ASSERT (!strcmp (context.key, "k"));
   BSON_ASSERT (context.type_code == '\x33');
}